

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_line.cpp
# Opt level: O3

void arrow_line_mask_proc(Am_Object *self,Am_Drawonable *drawonable,int x_offset,int y_offset)

{
  uint uVar1;
  uint uVar2;
  Am_Drawonable *pAVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  Am_Value *pAVar10;
  int iVar11;
  double dVar12;
  Am_Style ls;
  Am_Style local_80;
  double local_78;
  double local_70;
  int local_64;
  uint local_60;
  uint local_5c;
  double local_58;
  double local_50;
  ulong local_48;
  ulong local_40;
  Am_Drawonable *local_38;
  
  local_38 = drawonable;
  pAVar10 = Am_Object::Get(self,0x8b,0);
  iVar4 = Am_Value::operator_cast_to_int(pAVar10);
  pAVar10 = Am_Object::Get(self,0x8c,0);
  iVar5 = Am_Value::operator_cast_to_int(pAVar10);
  pAVar10 = Am_Object::Get(self,0x8d,0);
  iVar6 = Am_Value::operator_cast_to_int(pAVar10);
  local_60 = iVar6 + x_offset;
  local_40 = (ulong)(uint)x_offset;
  pAVar10 = Am_Object::Get(self,0x8e,0);
  iVar7 = Am_Value::operator_cast_to_int(pAVar10);
  local_5c = y_offset + iVar7;
  local_48 = (ulong)(uint)y_offset;
  pAVar10 = Am_Object::Get(self,0x91,0);
  iVar8 = Am_Value::operator_cast_to_int(pAVar10);
  pAVar10 = Am_Object::Get(self,0x90,0);
  iVar9 = Am_Value::operator_cast_to_int(pAVar10);
  pAVar3 = local_38;
  uVar1 = local_60;
  iVar6 = iVar6 - iVar4;
  iVar7 = iVar7 - iVar5;
  dVar12 = SQRT((double)(iVar7 * iVar7 + iVar6 * iVar6));
  local_58 = 1.0;
  if (1.0 <= dVar12) {
    local_58 = dVar12;
  }
  iVar11 = 1;
  if (1.0 <= dVar12) {
    iVar11 = iVar6;
  }
  local_78 = (double)(iVar11 * iVar9) / local_58;
  local_70 = (double)(iVar9 * iVar7) / local_58;
  local_50 = (double)(iVar11 * iVar8) / local_58;
  local_58 = (double)(iVar7 * iVar8) / local_58;
  local_64 = iVar5;
  pAVar10 = Am_Object::Get(self,0x6b,0);
  Am_Style::Am_Style(&local_80,pAVar10);
  uVar2 = local_5c;
  local_78 = (double)(int)uVar1 - local_78;
  local_70 = (double)(int)local_5c - local_70;
  (*pAVar3->_vptr_Am_Drawonable[0x28])
            (pAVar3,&local_80,(ulong)(uint)(int)(local_58 + local_78 + 0.5),
             (ulong)(uint)(int)((local_70 - local_50) + 0.5),(ulong)uVar1,(ulong)local_5c,7);
  (*pAVar3->_vptr_Am_Drawonable[0x28])
            (pAVar3,&local_80,(ulong)(uint)(iVar4 + (int)local_40),
             (ulong)(uint)(local_64 + (int)local_48),(ulong)uVar1,(ulong)uVar2,7);
  (*pAVar3->_vptr_Am_Drawonable[0x28])
            (pAVar3,&local_80,(ulong)(uint)(int)((local_78 - local_58) + 0.5),
             (ulong)(uint)(int)(local_70 + local_50 + 0.5),(ulong)uVar1,(ulong)uVar2,7);
  Am_Style::~Am_Style(&local_80);
  return;
}

Assistant:

Am_Define_Method(Am_Draw_Method, void, arrow_line_mask,
                 (Am_Object self, Am_Drawonable *drawonable, int x_offset,
                  int y_offset))
{
  int x1 = (int)self.Get(Am_X1) + x_offset;
  int y1 = (int)self.Get(Am_Y1) + y_offset;
  int x2 = (int)self.Get(Am_X2) + x_offset;
  int y2 = (int)self.Get(Am_Y2) + y_offset;
  int head_width = self.Get(Am_HEAD_WIDTH);
  int head_length = self.Get(Am_HEAD_LENGTH);
  int dx = x2 - x1;
  int dy = y2 - y1;
  double d = sqrt((double)(dx * dx + dy * dy));
  if (d < 1.0) {
    d = 1.0;
    dx = 1;
  }
  double lx = (head_length * dx) / d;
  double ly = (head_length * dy) / d;
  double wx = (head_width * dx) / d;
  double wy = (head_width * dy) / d;
  Am_Style ls = self.Get(Am_LINE_STYLE);

  //
  // WARNING!!	egcs 2.90.29 will hit an internal error if you swap the
  //			ordering of the first two calls.
  //
  drawonable->Draw_Line(ls, (int)(x2 - lx + wy + 0.5),
                        (int)(y2 - ly - wx + 0.5), x2, y2, Am_DRAW_MASK_COPY);
  drawonable->Draw_Line(ls, x1, y1, x2, y2, Am_DRAW_MASK_COPY);
  drawonable->Draw_Line(ls, (int)(x2 - lx - wy + 0.5),
                        (int)(y2 - ly + wx + 0.5), x2, y2, Am_DRAW_MASK_COPY);
}